

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall vm::VM::Tstore<double>(VM *this)

{
  undefined8 uVar1;
  int iVar2;
  slot_t *psVar3;
  
  ensureStackUsed(this,2);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -2;
  uVar1 = *(undefined8 *)
           ((this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl + (long)iVar2 + -2);
  ensureStackUsed(this,1);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -1;
  psVar3 = checkAddr(this,(this->_stack)._M_t.
                          super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar2 + -1],2);
  *(undefined8 *)psVar3 = uVar1;
  return;
}

Assistant:

void VM::Tstore() {
    auto value = POP<T>();
    auto addr = POP<addr_t>();
    WRITE(addr, value);
}